

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O0

string * read_file(string *__return_storage_ptr__,string *path)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  allocator<char> local_259;
  string local_258 [8];
  string buf;
  long local_228;
  ifstream stream;
  size_t read_size;
  string *path_local;
  string *out;
  
  std::ifstream::ifstream(&local_228,path,8);
  std::ios::exceptions((int)&local_228 + (int)*(undefined8 *)(local_228 + -0x18));
  buf.field_2._M_local_buf[0xb] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,0x1000,'\0',&local_259);
  std::allocator<char>::~allocator(&local_259);
  while( true ) {
    lVar2 = std::__cxx11::string::operator[]((ulong)local_258);
    plVar3 = (long *)std::istream::read((char *)&local_228,lVar2);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) break;
    std::istream::gcount();
    std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)local_258,0);
  }
  std::istream::gcount();
  std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)local_258,0);
  buf.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::~string(local_258);
  if ((buf.field_2._M_local_buf[0xb] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

auto read_file(std::string& path) -> std::string {
    constexpr auto read_size = std::size_t{4096};
    auto stream = std::ifstream{path};
    stream.exceptions(std::ios_base::badbit);

    auto out = std::string{};
    auto buf = std::string(read_size, '\0');
    while (stream.read(& buf[0], read_size)) {
        out.append(buf, 0, stream.gcount());
    }
    out.append(buf, 0, stream.gcount());
    return out;
}